

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall
slang::ast::PatternCaseStatement::serializeTo(PatternCaseStatement *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  Pattern *__n;
  Statement *__n_00;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  iterator local_98;
  ItemGroup *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL> *__range2;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  string_view local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string_view local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  PatternCaseStatement *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"condition");
  local_38 = ast::toString(this->condition);
  ASTSerializer::write(serializer,(int)local_28._M_len,local_28._M_str,local_38._M_len);
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"check");
  local_58 = ast::toString(this->check);
  ASTSerializer::write(pAVar1,(int)local_48._M_len,local_48._M_str,local_58._M_len);
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"expr");
  ASTSerializer::write(pAVar1,(int)local_68._M_len,local_68._M_str,(size_t)this->expr);
  pAVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"items");
  ASTSerializer::startArray(pAVar1,___range2);
  __begin2 = (iterator)&this->items;
  __end2 = nonstd::span_lite::
           span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>
                       *)__begin2);
  item = nonstd::span_lite::
         span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>::end
                   ((span<const_slang::ast::PatternCaseStatement::ItemGroup,_18446744073709551615UL>
                     *)__begin2);
  for (; __end2 != item; __end2 = __end2 + 1) {
    local_98 = __end2;
    ASTSerializer::startObject(local_18);
    pAVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"pattern");
    __n = not_null<const_slang::ast::Pattern_*>::operator*(&local_98->pattern);
    ASTSerializer::write(pAVar1,(int)local_a8._M_len,local_a8._M_str,(size_t)__n);
    pAVar1 = local_18;
    if (local_98->filter != (Expression *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"filter");
      ASTSerializer::write(pAVar1,(int)local_b8._M_len,local_b8._M_str,(size_t)local_98->filter);
    }
    pAVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"stmt");
    __n_00 = not_null<const_slang::ast::Statement_*>::operator*(&local_98->stmt);
    ASTSerializer::write(pAVar1,(int)local_c8._M_len,local_c8._M_str,(size_t)__n_00);
    ASTSerializer::endObject(local_18);
  }
  ASTSerializer::endArray(local_18);
  pAVar1 = local_18;
  if (this->defaultCase != (Statement *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_d8,"defaultCase");
    ASTSerializer::write(pAVar1,(int)local_d8._M_len,local_d8._M_str,(size_t)this->defaultCase);
  }
  return;
}

Assistant:

void PatternCaseStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("condition", toString(condition));
    serializer.write("check", toString(check));
    serializer.write("expr", expr);
    serializer.startArray("items");
    for (auto const& item : items) {
        serializer.startObject();
        serializer.write("pattern", *item.pattern);

        if (item.filter)
            serializer.write("filter", *item.filter);

        serializer.write("stmt", *item.stmt);
        serializer.endObject();
    }
    serializer.endArray();

    if (defaultCase) {
        serializer.write("defaultCase", *defaultCase);
    }
}